

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

char * Scl_LibertyFileContents(char *pFileName,int nContents)

{
  FILE *__stream;
  char *__ptr;
  
  __stream = fopen(pFileName,"rb");
  __ptr = (char *)malloc((long)(nContents + 1));
  fread(__ptr,(long)nContents,1,__stream);
  fclose(__stream);
  __ptr[nContents] = '\0';
  return __ptr;
}

Assistant:

char * Scl_LibertyFileContents( char * pFileName, int nContents )
{
    FILE * pFile = fopen( pFileName, "rb" );
    char * pContents = ABC_ALLOC( char, nContents+1 );
    int RetValue = 0;
    RetValue = fread( pContents, nContents, 1, pFile );
    fclose( pFile );
    pContents[nContents] = 0;
    return pContents;
}